

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O1

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  uv_barrier_t barrier;
  uv_thread_t threads [4];
  undefined1 local_58 [32];
  undefined1 auStack_38 [32];
  
  puVar2 = local_58;
  iVar1 = uv_barrier_init(local_58,5);
  if (iVar1 == 0) {
    lVar3 = 0;
    do {
      puVar2 = auStack_38 + lVar3;
      iVar1 = uv_thread_create(puVar2,serial_worker,local_58);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_00154f5a;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    iVar1 = uv_barrier_wait(local_58);
    if (0 < iVar1) {
      uv_barrier_destroy(local_58);
    }
    lVar3 = 0;
    while( true ) {
      puVar2 = auStack_38 + lVar3;
      iVar1 = uv_thread_join(puVar2);
      if (iVar1 != 0) break;
      lVar3 = lVar3 + 8;
      if (lVar3 == 0x20) {
        return 0;
      }
    }
LAB_00154f5a:
    run_test_barrier_serial_thread_cold_3();
  }
  run_test_barrier_serial_thread_cold_1();
  iVar1 = uv_barrier_wait();
  if (0 < iVar1) {
    uv_barrier_destroy(puVar2);
  }
  iVar1 = uv_sleep(100);
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT(0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_create(&threads[i], serial_worker, &barrier));

  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_join(&threads[i]));

  return 0;
}